

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall chaiscript::AST_Node_Trace::AST_Node_Trace(AST_Node_Trace *this,AST_Node *node)

{
  AST_Node *node_local;
  AST_Node_Trace *this_local;
  
  this->identifier = node->identifier;
  std::__cxx11::string::string((string *)&this->text,&node->text);
  Parse_Location::Parse_Location(&this->location,&node->location);
  get_children(&this->children,this,node);
  return;
}

Assistant:

AST_Node_Trace(const AST_Node &node)
        : identifier(node.identifier)
        , text(node.text)
        , location(node.location)
        , children(get_children(node)) {
    }